

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthStretch(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar;
  bool bVar7;
  
  iVar6 = nVars + -1;
  if (nVarsAll < 1) {
    bVar7 = true;
  }
  else {
    uVar3 = 0;
    uVar4 = nVarsAll;
    do {
      uVar1 = uVar4 - 1;
      if ((Phase >> (uVar1 & 0x1f) & 1) != 0) {
        if (iVar6 < (int)uVar1) {
          puVar2 = pIn;
          iVar = iVar6;
          do {
            pIn = pOut;
            pOut = puVar2;
            Extra_TruthSwapAdjacentVars(pIn,pOut,nVarsAll,iVar);
            iVar = iVar + 1;
            puVar2 = pIn;
          } while (iVar < (int)uVar1);
          uVar3 = (uVar3 + uVar1) - iVar6;
        }
        iVar6 = iVar6 + -1;
      }
      bVar7 = 1 < (int)uVar4;
      uVar4 = uVar1;
    } while (bVar7);
    bVar7 = (uVar3 & 1) == 0;
  }
  if (iVar6 == -1) {
    if (bVar7) {
      uVar4 = 1 << ((char)nVarsAll - 5U & 0x1f);
      if (nVarsAll < 6) {
        uVar4 = 1;
      }
      if (0 < (int)uVar4) {
        lVar5 = (ulong)uVar4 + 1;
        do {
          pOut[lVar5 + -2] = pIn[lVar5 + -2];
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
    }
    return;
  }
  __assert_fail("Var == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                ,0xf9,
                "void Extra_TruthStretch(unsigned int *, unsigned int *, int, int, unsigned int)");
}

Assistant:

void Extra_TruthStretch( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = nVars - 1, Counter = 0;
    for ( i = nVarsAll - 1; i >= 0; i-- )
        if ( Phase & (1 << i) )
        {
            for ( k = Var; k < i; k++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var--;
        }
    assert( Var == -1 );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}